

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O1

int base64_stream_decode_sse41(base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  byte bVar1;
  ushort uVar2;
  undefined1 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  uint uVar10;
  int iVar11;
  size_t sVar12;
  bool bVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  size_t sVar17;
  size_t sVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i hi;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  
  iVar11 = state->eof;
  if (iVar11 != 0) {
    *outlen = 0;
    if (iVar11 == 1 && srclen != 0) {
      state->eof = 2;
      state->bytes = 0;
      bVar13 = srclen == 1 && base64_table_dec_8bit[(byte)*src] == 0xfe;
    }
    else {
      bVar13 = false;
    }
    goto LAB_001054ea;
  }
  bVar15 = state->carry;
  sVar18 = (size_t)(uint)state->bytes;
  iVar11 = 0;
  sVar17 = 0;
  sVar12 = srclen;
  uVar10 = state->bytes;
  switch(sVar18) {
  case 0:
    do {
      auVar8 = _DAT_0010c050;
      auVar7 = _DAT_0010c040;
      auVar6 = _DAT_0010c030;
      auVar5 = _DAT_0010c010;
      auVar4 = _DAT_0010c000;
      auVar22 = _DAT_0010bff0;
      auVar21 = _DAT_0010bfe0;
      if (0x17 < srclen) {
        uVar19 = srclen - 8 >> 4;
        auVar20 = ZEXT816(0xb9b9bfbf04131000);
        uVar14 = uVar19;
LAB_00104e52:
        cVar23 = auVar4[0];
        cVar24 = auVar4[1];
        cVar25 = auVar4[2];
        cVar26 = auVar4[3];
        cVar27 = auVar4[4];
        cVar28 = auVar4[5];
        cVar29 = auVar4[6];
        cVar30 = auVar4[7];
        cVar31 = auVar4[8];
        cVar32 = auVar4[9];
        cVar33 = auVar4[10];
        cVar34 = auVar4[0xb];
        cVar35 = auVar4[0xc];
        cVar36 = auVar4[0xd];
        cVar37 = auVar4[0xe];
        cVar38 = auVar4[0xf];
        if (7 < uVar14) {
          auVar57 = *(undefined1 (*) [16])src;
          auVar39._0_4_ = auVar57._0_4_ >> 4;
          auVar39._4_4_ = auVar57._4_4_ >> 4;
          auVar39._8_4_ = auVar57._8_4_ >> 4;
          auVar39._12_4_ = auVar57._12_4_ >> 4;
          auVar39 = auVar39 & auVar21;
          auVar55 = pshufb(auVar22,auVar39);
          auVar65 = pshufb(auVar5,auVar57 & auVar4);
          auVar65 = auVar65 & auVar55;
          auVar55[0] = -('\0' < auVar65[0]);
          auVar55[1] = -('\0' < auVar65[1]);
          auVar55[2] = -('\0' < auVar65[2]);
          auVar55[3] = -('\0' < auVar65[3]);
          auVar55[4] = -('\0' < auVar65[4]);
          auVar55[5] = -('\0' < auVar65[5]);
          auVar55[6] = -('\0' < auVar65[6]);
          auVar55[7] = -('\0' < auVar65[7]);
          auVar55[8] = -('\0' < auVar65[8]);
          auVar55[9] = -('\0' < auVar65[9]);
          auVar55[10] = -('\0' < auVar65[10]);
          auVar55[0xb] = -('\0' < auVar65[0xb]);
          auVar55[0xc] = -('\0' < auVar65[0xc]);
          auVar55[0xd] = -('\0' < auVar65[0xd]);
          auVar55[0xe] = -('\0' < auVar65[0xe]);
          bVar13 = '\0' < auVar65[0xf];
          auVar55[0xf] = -bVar13;
          if ((((((((((((((((auVar55 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar55 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar55 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar55 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar55 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar55 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar55 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar55 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar55 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar55 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar55 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar55 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar55[0xf]) {
            auVar65[0] = auVar39[0] - (auVar57[0] == cVar23);
            auVar65[1] = auVar39[1] - (auVar57[1] == cVar24);
            auVar65[2] = auVar39[2] - (auVar57[2] == cVar25);
            auVar65[3] = auVar39[3] - (auVar57[3] == cVar26);
            auVar65[4] = auVar39[4] - (auVar57[4] == cVar27);
            auVar65[5] = auVar39[5] - (auVar57[5] == cVar28);
            auVar65[6] = auVar39[6] - (auVar57[6] == cVar29);
            auVar65[7] = auVar39[7] - (auVar57[7] == cVar30);
            auVar65[8] = auVar39[8] - (auVar57[8] == cVar31);
            auVar65[9] = auVar39[9] - (auVar57[9] == cVar32);
            auVar65[10] = auVar39[10] - (auVar57[10] == cVar33);
            auVar65[0xb] = auVar39[0xb] - (auVar57[0xb] == cVar34);
            auVar65[0xc] = auVar39[0xc] - (auVar57[0xc] == cVar35);
            auVar65[0xd] = auVar39[0xd] - (auVar57[0xd] == cVar36);
            auVar65[0xe] = auVar39[0xe] - (auVar57[0xe] == cVar37);
            auVar65[0xf] = auVar39[0xf] - (auVar57[0xf] == cVar38);
            auVar39 = pshufb(auVar20,auVar65);
            auVar56[0] = auVar39[0] + auVar57[0];
            auVar56[1] = auVar39[1] + auVar57[1];
            auVar56[2] = auVar39[2] + auVar57[2];
            auVar56[3] = auVar39[3] + auVar57[3];
            auVar56[4] = auVar39[4] + auVar57[4];
            auVar56[5] = auVar39[5] + auVar57[5];
            auVar56[6] = auVar39[6] + auVar57[6];
            auVar56[7] = auVar39[7] + auVar57[7];
            auVar56[8] = auVar39[8] + auVar57[8];
            auVar56[9] = auVar39[9] + auVar57[9];
            auVar56[10] = auVar39[10] + auVar57[10];
            auVar56[0xb] = auVar39[0xb] + auVar57[0xb];
            auVar56[0xc] = auVar39[0xc] + auVar57[0xc];
            auVar56[0xd] = auVar39[0xd] + auVar57[0xd];
            auVar56[0xe] = auVar39[0xe] + auVar57[0xe];
            auVar56[0xf] = auVar39[0xf] + auVar57[0xf];
            auVar57 = pmaddubsw(auVar56,auVar6);
            auVar57 = pmaddwd(auVar57,auVar7);
            auVar57 = pshufb(auVar57,auVar8);
            *(undefined1 (*) [16])out = auVar57;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar14 = uVar14 - 1;
          }
          if ((((((((((((((((auVar55 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar55 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar55 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar55 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar55 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar55 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar55 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar55 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar55 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar55 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar55 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar55 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar13)
          goto LAB_001053a0;
          auVar57 = *(undefined1 (*) [16])src;
          auVar40._0_4_ = auVar57._0_4_ >> 4;
          auVar40._4_4_ = auVar57._4_4_ >> 4;
          auVar40._8_4_ = auVar57._8_4_ >> 4;
          auVar40._12_4_ = auVar57._12_4_ >> 4;
          auVar40 = auVar40 & auVar21;
          auVar39 = pshufb(auVar22,auVar40);
          auVar55 = pshufb(auVar5,auVar57 & auVar4);
          auVar55 = auVar55 & auVar39;
          auVar66[0] = -('\0' < auVar55[0]);
          auVar66[1] = -('\0' < auVar55[1]);
          auVar66[2] = -('\0' < auVar55[2]);
          auVar66[3] = -('\0' < auVar55[3]);
          auVar66[4] = -('\0' < auVar55[4]);
          auVar66[5] = -('\0' < auVar55[5]);
          auVar66[6] = -('\0' < auVar55[6]);
          auVar66[7] = -('\0' < auVar55[7]);
          auVar66[8] = -('\0' < auVar55[8]);
          auVar66[9] = -('\0' < auVar55[9]);
          auVar66[10] = -('\0' < auVar55[10]);
          auVar66[0xb] = -('\0' < auVar55[0xb]);
          auVar66[0xc] = -('\0' < auVar55[0xc]);
          auVar66[0xd] = -('\0' < auVar55[0xd]);
          auVar66[0xe] = -('\0' < auVar55[0xe]);
          bVar13 = '\0' < auVar55[0xf];
          auVar66[0xf] = -bVar13;
          if ((((((((((((((((auVar66 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar66 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar66 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar66 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar66 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar66 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar66 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar66 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar66 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar66 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar66 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar66 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar66[0xf]) {
            auVar41[0] = auVar40[0] - (auVar57[0] == cVar23);
            auVar41[1] = auVar40[1] - (auVar57[1] == cVar24);
            auVar41[2] = auVar40[2] - (auVar57[2] == cVar25);
            auVar41[3] = auVar40[3] - (auVar57[3] == cVar26);
            auVar41[4] = auVar40[4] - (auVar57[4] == cVar27);
            auVar41[5] = auVar40[5] - (auVar57[5] == cVar28);
            auVar41[6] = auVar40[6] - (auVar57[6] == cVar29);
            auVar41[7] = auVar40[7] - (auVar57[7] == cVar30);
            auVar41[8] = auVar40[8] - (auVar57[8] == cVar31);
            auVar41[9] = auVar40[9] - (auVar57[9] == cVar32);
            auVar41[10] = auVar40[10] - (auVar57[10] == cVar33);
            auVar41[0xb] = auVar40[0xb] - (auVar57[0xb] == cVar34);
            auVar41[0xc] = auVar40[0xc] - (auVar57[0xc] == cVar35);
            auVar41[0xd] = auVar40[0xd] - (auVar57[0xd] == cVar36);
            auVar41[0xe] = auVar40[0xe] - (auVar57[0xe] == cVar37);
            auVar41[0xf] = auVar40[0xf] - (auVar57[0xf] == cVar38);
            auVar39 = pshufb(auVar20,auVar41);
            auVar58[0] = auVar39[0] + auVar57[0];
            auVar58[1] = auVar39[1] + auVar57[1];
            auVar58[2] = auVar39[2] + auVar57[2];
            auVar58[3] = auVar39[3] + auVar57[3];
            auVar58[4] = auVar39[4] + auVar57[4];
            auVar58[5] = auVar39[5] + auVar57[5];
            auVar58[6] = auVar39[6] + auVar57[6];
            auVar58[7] = auVar39[7] + auVar57[7];
            auVar58[8] = auVar39[8] + auVar57[8];
            auVar58[9] = auVar39[9] + auVar57[9];
            auVar58[10] = auVar39[10] + auVar57[10];
            auVar58[0xb] = auVar39[0xb] + auVar57[0xb];
            auVar58[0xc] = auVar39[0xc] + auVar57[0xc];
            auVar58[0xd] = auVar39[0xd] + auVar57[0xd];
            auVar58[0xe] = auVar39[0xe] + auVar57[0xe];
            auVar58[0xf] = auVar39[0xf] + auVar57[0xf];
            auVar57 = pmaddubsw(auVar58,auVar6);
            auVar57 = pmaddwd(auVar57,auVar7);
            auVar57 = pshufb(auVar57,auVar8);
            *(undefined1 (*) [16])out = auVar57;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar14 = uVar14 - 1;
          }
          if ((((((((((((((((auVar66 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar66 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar66 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar66 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar66 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar66 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar66 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar66 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar66 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar66 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar66 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar66 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar13)
          goto LAB_001053a0;
          auVar57 = *(undefined1 (*) [16])src;
          auVar42._0_4_ = auVar57._0_4_ >> 4;
          auVar42._4_4_ = auVar57._4_4_ >> 4;
          auVar42._8_4_ = auVar57._8_4_ >> 4;
          auVar42._12_4_ = auVar57._12_4_ >> 4;
          auVar42 = auVar42 & auVar21;
          auVar39 = pshufb(auVar22,auVar42);
          auVar55 = pshufb(auVar5,auVar57 & auVar4);
          auVar55 = auVar55 & auVar39;
          auVar67[0] = -('\0' < auVar55[0]);
          auVar67[1] = -('\0' < auVar55[1]);
          auVar67[2] = -('\0' < auVar55[2]);
          auVar67[3] = -('\0' < auVar55[3]);
          auVar67[4] = -('\0' < auVar55[4]);
          auVar67[5] = -('\0' < auVar55[5]);
          auVar67[6] = -('\0' < auVar55[6]);
          auVar67[7] = -('\0' < auVar55[7]);
          auVar67[8] = -('\0' < auVar55[8]);
          auVar67[9] = -('\0' < auVar55[9]);
          auVar67[10] = -('\0' < auVar55[10]);
          auVar67[0xb] = -('\0' < auVar55[0xb]);
          auVar67[0xc] = -('\0' < auVar55[0xc]);
          auVar67[0xd] = -('\0' < auVar55[0xd]);
          auVar67[0xe] = -('\0' < auVar55[0xe]);
          bVar13 = '\0' < auVar55[0xf];
          auVar67[0xf] = -bVar13;
          if ((((((((((((((((auVar67 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar67 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar67 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar67 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar67 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar67 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar67 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar67 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar67 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar67 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar67 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar67 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar67 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar67 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar67 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar67[0xf]) {
            auVar43[0] = auVar42[0] - (auVar57[0] == cVar23);
            auVar43[1] = auVar42[1] - (auVar57[1] == cVar24);
            auVar43[2] = auVar42[2] - (auVar57[2] == cVar25);
            auVar43[3] = auVar42[3] - (auVar57[3] == cVar26);
            auVar43[4] = auVar42[4] - (auVar57[4] == cVar27);
            auVar43[5] = auVar42[5] - (auVar57[5] == cVar28);
            auVar43[6] = auVar42[6] - (auVar57[6] == cVar29);
            auVar43[7] = auVar42[7] - (auVar57[7] == cVar30);
            auVar43[8] = auVar42[8] - (auVar57[8] == cVar31);
            auVar43[9] = auVar42[9] - (auVar57[9] == cVar32);
            auVar43[10] = auVar42[10] - (auVar57[10] == cVar33);
            auVar43[0xb] = auVar42[0xb] - (auVar57[0xb] == cVar34);
            auVar43[0xc] = auVar42[0xc] - (auVar57[0xc] == cVar35);
            auVar43[0xd] = auVar42[0xd] - (auVar57[0xd] == cVar36);
            auVar43[0xe] = auVar42[0xe] - (auVar57[0xe] == cVar37);
            auVar43[0xf] = auVar42[0xf] - (auVar57[0xf] == cVar38);
            auVar39 = pshufb(auVar20,auVar43);
            auVar59[0] = auVar39[0] + auVar57[0];
            auVar59[1] = auVar39[1] + auVar57[1];
            auVar59[2] = auVar39[2] + auVar57[2];
            auVar59[3] = auVar39[3] + auVar57[3];
            auVar59[4] = auVar39[4] + auVar57[4];
            auVar59[5] = auVar39[5] + auVar57[5];
            auVar59[6] = auVar39[6] + auVar57[6];
            auVar59[7] = auVar39[7] + auVar57[7];
            auVar59[8] = auVar39[8] + auVar57[8];
            auVar59[9] = auVar39[9] + auVar57[9];
            auVar59[10] = auVar39[10] + auVar57[10];
            auVar59[0xb] = auVar39[0xb] + auVar57[0xb];
            auVar59[0xc] = auVar39[0xc] + auVar57[0xc];
            auVar59[0xd] = auVar39[0xd] + auVar57[0xd];
            auVar59[0xe] = auVar39[0xe] + auVar57[0xe];
            auVar59[0xf] = auVar39[0xf] + auVar57[0xf];
            auVar57 = pmaddubsw(auVar59,auVar6);
            auVar57 = pmaddwd(auVar57,auVar7);
            auVar57 = pshufb(auVar57,auVar8);
            *(undefined1 (*) [16])out = auVar57;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar14 = uVar14 - 1;
          }
          if ((((((((((((((((auVar67 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar67 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar67 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar67 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar67 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar67 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar67 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar67 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar67 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar67 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar67 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar67 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar13)
          goto LAB_001053a0;
          auVar57 = *(undefined1 (*) [16])src;
          auVar44._0_4_ = auVar57._0_4_ >> 4;
          auVar44._4_4_ = auVar57._4_4_ >> 4;
          auVar44._8_4_ = auVar57._8_4_ >> 4;
          auVar44._12_4_ = auVar57._12_4_ >> 4;
          auVar44 = auVar44 & auVar21;
          auVar39 = pshufb(auVar22,auVar44);
          auVar55 = pshufb(auVar5,auVar57 & auVar4);
          auVar55 = auVar55 & auVar39;
          auVar68[0] = -('\0' < auVar55[0]);
          auVar68[1] = -('\0' < auVar55[1]);
          auVar68[2] = -('\0' < auVar55[2]);
          auVar68[3] = -('\0' < auVar55[3]);
          auVar68[4] = -('\0' < auVar55[4]);
          auVar68[5] = -('\0' < auVar55[5]);
          auVar68[6] = -('\0' < auVar55[6]);
          auVar68[7] = -('\0' < auVar55[7]);
          auVar68[8] = -('\0' < auVar55[8]);
          auVar68[9] = -('\0' < auVar55[9]);
          auVar68[10] = -('\0' < auVar55[10]);
          auVar68[0xb] = -('\0' < auVar55[0xb]);
          auVar68[0xc] = -('\0' < auVar55[0xc]);
          auVar68[0xd] = -('\0' < auVar55[0xd]);
          auVar68[0xe] = -('\0' < auVar55[0xe]);
          bVar13 = '\0' < auVar55[0xf];
          auVar68[0xf] = -bVar13;
          if ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar68 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar68 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar68 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar68 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar68 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar68 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar68 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar68 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar68 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar68 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar68 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar68 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar68 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar68 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar68[0xf]) {
            auVar45[0] = auVar44[0] - (auVar57[0] == cVar23);
            auVar45[1] = auVar44[1] - (auVar57[1] == cVar24);
            auVar45[2] = auVar44[2] - (auVar57[2] == cVar25);
            auVar45[3] = auVar44[3] - (auVar57[3] == cVar26);
            auVar45[4] = auVar44[4] - (auVar57[4] == cVar27);
            auVar45[5] = auVar44[5] - (auVar57[5] == cVar28);
            auVar45[6] = auVar44[6] - (auVar57[6] == cVar29);
            auVar45[7] = auVar44[7] - (auVar57[7] == cVar30);
            auVar45[8] = auVar44[8] - (auVar57[8] == cVar31);
            auVar45[9] = auVar44[9] - (auVar57[9] == cVar32);
            auVar45[10] = auVar44[10] - (auVar57[10] == cVar33);
            auVar45[0xb] = auVar44[0xb] - (auVar57[0xb] == cVar34);
            auVar45[0xc] = auVar44[0xc] - (auVar57[0xc] == cVar35);
            auVar45[0xd] = auVar44[0xd] - (auVar57[0xd] == cVar36);
            auVar45[0xe] = auVar44[0xe] - (auVar57[0xe] == cVar37);
            auVar45[0xf] = auVar44[0xf] - (auVar57[0xf] == cVar38);
            auVar39 = pshufb(auVar20,auVar45);
            auVar60[0] = auVar39[0] + auVar57[0];
            auVar60[1] = auVar39[1] + auVar57[1];
            auVar60[2] = auVar39[2] + auVar57[2];
            auVar60[3] = auVar39[3] + auVar57[3];
            auVar60[4] = auVar39[4] + auVar57[4];
            auVar60[5] = auVar39[5] + auVar57[5];
            auVar60[6] = auVar39[6] + auVar57[6];
            auVar60[7] = auVar39[7] + auVar57[7];
            auVar60[8] = auVar39[8] + auVar57[8];
            auVar60[9] = auVar39[9] + auVar57[9];
            auVar60[10] = auVar39[10] + auVar57[10];
            auVar60[0xb] = auVar39[0xb] + auVar57[0xb];
            auVar60[0xc] = auVar39[0xc] + auVar57[0xc];
            auVar60[0xd] = auVar39[0xd] + auVar57[0xd];
            auVar60[0xe] = auVar39[0xe] + auVar57[0xe];
            auVar60[0xf] = auVar39[0xf] + auVar57[0xf];
            auVar57 = pmaddubsw(auVar60,auVar6);
            auVar57 = pmaddwd(auVar57,auVar7);
            auVar57 = pshufb(auVar57,auVar8);
            *(undefined1 (*) [16])out = auVar57;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar14 = uVar14 - 1;
          }
          if ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar68 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar68 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar68 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar68 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar68 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar68 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar68 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar68 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar68 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar68 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar68 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar13)
          goto LAB_001053a0;
LAB_001050ab:
          auVar57 = *(undefined1 (*) [16])src;
          auVar46._0_4_ = auVar57._0_4_ >> 4;
          auVar46._4_4_ = auVar57._4_4_ >> 4;
          auVar46._8_4_ = auVar57._8_4_ >> 4;
          auVar46._12_4_ = auVar57._12_4_ >> 4;
          auVar46 = auVar46 & auVar21;
          auVar39 = pshufb(auVar22,auVar46);
          auVar55 = pshufb(auVar5,auVar57 & auVar4);
          auVar55 = auVar55 & auVar39;
          auVar69[0] = -('\0' < auVar55[0]);
          auVar69[1] = -('\0' < auVar55[1]);
          auVar69[2] = -('\0' < auVar55[2]);
          auVar69[3] = -('\0' < auVar55[3]);
          auVar69[4] = -('\0' < auVar55[4]);
          auVar69[5] = -('\0' < auVar55[5]);
          auVar69[6] = -('\0' < auVar55[6]);
          auVar69[7] = -('\0' < auVar55[7]);
          auVar69[8] = -('\0' < auVar55[8]);
          auVar69[9] = -('\0' < auVar55[9]);
          auVar69[10] = -('\0' < auVar55[10]);
          auVar69[0xb] = -('\0' < auVar55[0xb]);
          auVar69[0xc] = -('\0' < auVar55[0xc]);
          auVar69[0xd] = -('\0' < auVar55[0xd]);
          auVar69[0xe] = -('\0' < auVar55[0xe]);
          bVar13 = '\0' < auVar55[0xf];
          auVar69[0xf] = -bVar13;
          if ((((((((((((((((auVar69 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar69 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar69 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar69 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar69 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar69 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar69 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar69 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar69 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar69 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar69 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar69 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar69 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar69 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar69 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar69[0xf]) {
            auVar47[0] = auVar46[0] - (auVar57[0] == cVar23);
            auVar47[1] = auVar46[1] - (auVar57[1] == cVar24);
            auVar47[2] = auVar46[2] - (auVar57[2] == cVar25);
            auVar47[3] = auVar46[3] - (auVar57[3] == cVar26);
            auVar47[4] = auVar46[4] - (auVar57[4] == cVar27);
            auVar47[5] = auVar46[5] - (auVar57[5] == cVar28);
            auVar47[6] = auVar46[6] - (auVar57[6] == cVar29);
            auVar47[7] = auVar46[7] - (auVar57[7] == cVar30);
            auVar47[8] = auVar46[8] - (auVar57[8] == cVar31);
            auVar47[9] = auVar46[9] - (auVar57[9] == cVar32);
            auVar47[10] = auVar46[10] - (auVar57[10] == cVar33);
            auVar47[0xb] = auVar46[0xb] - (auVar57[0xb] == cVar34);
            auVar47[0xc] = auVar46[0xc] - (auVar57[0xc] == cVar35);
            auVar47[0xd] = auVar46[0xd] - (auVar57[0xd] == cVar36);
            auVar47[0xe] = auVar46[0xe] - (auVar57[0xe] == cVar37);
            auVar47[0xf] = auVar46[0xf] - (auVar57[0xf] == cVar38);
            auVar39 = pshufb(auVar20,auVar47);
            auVar61[0] = auVar39[0] + auVar57[0];
            auVar61[1] = auVar39[1] + auVar57[1];
            auVar61[2] = auVar39[2] + auVar57[2];
            auVar61[3] = auVar39[3] + auVar57[3];
            auVar61[4] = auVar39[4] + auVar57[4];
            auVar61[5] = auVar39[5] + auVar57[5];
            auVar61[6] = auVar39[6] + auVar57[6];
            auVar61[7] = auVar39[7] + auVar57[7];
            auVar61[8] = auVar39[8] + auVar57[8];
            auVar61[9] = auVar39[9] + auVar57[9];
            auVar61[10] = auVar39[10] + auVar57[10];
            auVar61[0xb] = auVar39[0xb] + auVar57[0xb];
            auVar61[0xc] = auVar39[0xc] + auVar57[0xc];
            auVar61[0xd] = auVar39[0xd] + auVar57[0xd];
            auVar61[0xe] = auVar39[0xe] + auVar57[0xe];
            auVar61[0xf] = auVar39[0xf] + auVar57[0xf];
            auVar57 = pmaddubsw(auVar61,auVar6);
            auVar57 = pmaddwd(auVar57,auVar7);
            auVar57 = pshufb(auVar57,auVar8);
            *(undefined1 (*) [16])out = auVar57;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar14 = uVar14 - 1;
          }
          if ((((((((((((((((auVar69 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar69 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar69 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar69 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar69 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar69 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar69 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar69 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar69 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar69 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar69 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar69 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar13)
          goto LAB_001053a0;
          auVar57 = *(undefined1 (*) [16])src;
          auVar48._0_4_ = auVar57._0_4_ >> 4;
          auVar48._4_4_ = auVar57._4_4_ >> 4;
          auVar48._8_4_ = auVar57._8_4_ >> 4;
          auVar48._12_4_ = auVar57._12_4_ >> 4;
          auVar48 = auVar48 & auVar21;
          auVar39 = pshufb(auVar22,auVar48);
          auVar55 = pshufb(auVar5,auVar57 & auVar4);
          auVar55 = auVar55 & auVar39;
          auVar70[0] = -('\0' < auVar55[0]);
          auVar70[1] = -('\0' < auVar55[1]);
          auVar70[2] = -('\0' < auVar55[2]);
          auVar70[3] = -('\0' < auVar55[3]);
          auVar70[4] = -('\0' < auVar55[4]);
          auVar70[5] = -('\0' < auVar55[5]);
          auVar70[6] = -('\0' < auVar55[6]);
          auVar70[7] = -('\0' < auVar55[7]);
          auVar70[8] = -('\0' < auVar55[8]);
          auVar70[9] = -('\0' < auVar55[9]);
          auVar70[10] = -('\0' < auVar55[10]);
          auVar70[0xb] = -('\0' < auVar55[0xb]);
          auVar70[0xc] = -('\0' < auVar55[0xc]);
          auVar70[0xd] = -('\0' < auVar55[0xd]);
          auVar70[0xe] = -('\0' < auVar55[0xe]);
          bVar13 = '\0' < auVar55[0xf];
          auVar70[0xf] = -bVar13;
          if ((((((((((((((((auVar70 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar70 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar70 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar70 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar70 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar70 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar70 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar70 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar70 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar70 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar70 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar70 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar70 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar70 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar70[0xf]) {
            auVar49[0] = auVar48[0] - (auVar57[0] == cVar23);
            auVar49[1] = auVar48[1] - (auVar57[1] == cVar24);
            auVar49[2] = auVar48[2] - (auVar57[2] == cVar25);
            auVar49[3] = auVar48[3] - (auVar57[3] == cVar26);
            auVar49[4] = auVar48[4] - (auVar57[4] == cVar27);
            auVar49[5] = auVar48[5] - (auVar57[5] == cVar28);
            auVar49[6] = auVar48[6] - (auVar57[6] == cVar29);
            auVar49[7] = auVar48[7] - (auVar57[7] == cVar30);
            auVar49[8] = auVar48[8] - (auVar57[8] == cVar31);
            auVar49[9] = auVar48[9] - (auVar57[9] == cVar32);
            auVar49[10] = auVar48[10] - (auVar57[10] == cVar33);
            auVar49[0xb] = auVar48[0xb] - (auVar57[0xb] == cVar34);
            auVar49[0xc] = auVar48[0xc] - (auVar57[0xc] == cVar35);
            auVar49[0xd] = auVar48[0xd] - (auVar57[0xd] == cVar36);
            auVar49[0xe] = auVar48[0xe] - (auVar57[0xe] == cVar37);
            auVar49[0xf] = auVar48[0xf] - (auVar57[0xf] == cVar38);
            auVar39 = pshufb(auVar20,auVar49);
            auVar62[0] = auVar39[0] + auVar57[0];
            auVar62[1] = auVar39[1] + auVar57[1];
            auVar62[2] = auVar39[2] + auVar57[2];
            auVar62[3] = auVar39[3] + auVar57[3];
            auVar62[4] = auVar39[4] + auVar57[4];
            auVar62[5] = auVar39[5] + auVar57[5];
            auVar62[6] = auVar39[6] + auVar57[6];
            auVar62[7] = auVar39[7] + auVar57[7];
            auVar62[8] = auVar39[8] + auVar57[8];
            auVar62[9] = auVar39[9] + auVar57[9];
            auVar62[10] = auVar39[10] + auVar57[10];
            auVar62[0xb] = auVar39[0xb] + auVar57[0xb];
            auVar62[0xc] = auVar39[0xc] + auVar57[0xc];
            auVar62[0xd] = auVar39[0xd] + auVar57[0xd];
            auVar62[0xe] = auVar39[0xe] + auVar57[0xe];
            auVar62[0xf] = auVar39[0xf] + auVar57[0xf];
            auVar57 = pmaddubsw(auVar62,auVar6);
            auVar57 = pmaddwd(auVar57,auVar7);
            auVar57 = pshufb(auVar57,auVar8);
            *(undefined1 (*) [16])out = auVar57;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar14 = uVar14 - 1;
          }
          if ((((((((((((((((auVar70 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar70 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar70 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar70 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar70 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar70 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar70 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar70 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar70 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar70 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar70 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar70 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar13)
          goto LAB_001053a0;
          auVar57 = *(undefined1 (*) [16])src;
          auVar50._0_4_ = auVar57._0_4_ >> 4;
          auVar50._4_4_ = auVar57._4_4_ >> 4;
          auVar50._8_4_ = auVar57._8_4_ >> 4;
          auVar50._12_4_ = auVar57._12_4_ >> 4;
          auVar50 = auVar50 & auVar21;
          auVar39 = pshufb(auVar22,auVar50);
          auVar55 = pshufb(auVar5,auVar57 & auVar4);
          auVar55 = auVar55 & auVar39;
          auVar71[0] = -('\0' < auVar55[0]);
          auVar71[1] = -('\0' < auVar55[1]);
          auVar71[2] = -('\0' < auVar55[2]);
          auVar71[3] = -('\0' < auVar55[3]);
          auVar71[4] = -('\0' < auVar55[4]);
          auVar71[5] = -('\0' < auVar55[5]);
          auVar71[6] = -('\0' < auVar55[6]);
          auVar71[7] = -('\0' < auVar55[7]);
          auVar71[8] = -('\0' < auVar55[8]);
          auVar71[9] = -('\0' < auVar55[9]);
          auVar71[10] = -('\0' < auVar55[10]);
          auVar71[0xb] = -('\0' < auVar55[0xb]);
          auVar71[0xc] = -('\0' < auVar55[0xc]);
          auVar71[0xd] = -('\0' < auVar55[0xd]);
          auVar71[0xe] = -('\0' < auVar55[0xe]);
          auVar71[0xf] = -('\0' < auVar55[0xf]);
          uVar2 = (ushort)(SUB161(auVar71 >> 7,0) & 1) | (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar71[0xf] >> 7) << 0xf;
joined_r0x0010534a:
          if (uVar2 != 0) goto LAB_001053a0;
          auVar51[0] = auVar50[0] - (auVar57[0] == cVar23);
          auVar51[1] = auVar50[1] - (auVar57[1] == cVar24);
          auVar51[2] = auVar50[2] - (auVar57[2] == cVar25);
          auVar51[3] = auVar50[3] - (auVar57[3] == cVar26);
          auVar51[4] = auVar50[4] - (auVar57[4] == cVar27);
          auVar51[5] = auVar50[5] - (auVar57[5] == cVar28);
          auVar51[6] = auVar50[6] - (auVar57[6] == cVar29);
          auVar51[7] = auVar50[7] - (auVar57[7] == cVar30);
          auVar51[8] = auVar50[8] - (auVar57[8] == cVar31);
          auVar51[9] = auVar50[9] - (auVar57[9] == cVar32);
          auVar51[10] = auVar50[10] - (auVar57[10] == cVar33);
          auVar51[0xb] = auVar50[0xb] - (auVar57[0xb] == cVar34);
          auVar51[0xc] = auVar50[0xc] - (auVar57[0xc] == cVar35);
          auVar51[0xd] = auVar50[0xd] - (auVar57[0xd] == cVar36);
          auVar51[0xe] = auVar50[0xe] - (auVar57[0xe] == cVar37);
          auVar51[0xf] = auVar50[0xf] - (auVar57[0xf] == cVar38);
          auVar39 = pshufb(auVar20,auVar51);
          auVar63[0] = auVar39[0] + auVar57[0];
          auVar63[1] = auVar39[1] + auVar57[1];
          auVar63[2] = auVar39[2] + auVar57[2];
          auVar63[3] = auVar39[3] + auVar57[3];
          auVar63[4] = auVar39[4] + auVar57[4];
          auVar63[5] = auVar39[5] + auVar57[5];
          auVar63[6] = auVar39[6] + auVar57[6];
          auVar63[7] = auVar39[7] + auVar57[7];
          auVar63[8] = auVar39[8] + auVar57[8];
          auVar63[9] = auVar39[9] + auVar57[9];
          auVar63[10] = auVar39[10] + auVar57[10];
          auVar63[0xb] = auVar39[0xb] + auVar57[0xb];
          auVar63[0xc] = auVar39[0xc] + auVar57[0xc];
          auVar63[0xd] = auVar39[0xd] + auVar57[0xd];
          auVar63[0xe] = auVar39[0xe] + auVar57[0xe];
          auVar63[0xf] = auVar39[0xf] + auVar57[0xf];
          auVar57 = pmaddubsw(auVar63,auVar6);
          auVar57 = pmaddwd(auVar57,auVar7);
          auVar57 = pshufb(auVar57,auVar8);
          *(undefined1 (*) [16])out = auVar57;
          src = (char *)((long)src + 0x10);
          out = *(undefined1 (*) [16])out + 0xc;
          auVar57 = *(undefined1 (*) [16])src;
          auVar52._0_4_ = auVar57._0_4_ >> 4;
          auVar52._4_4_ = auVar57._4_4_ >> 4;
          auVar52._8_4_ = auVar57._8_4_ >> 4;
          auVar52._12_4_ = auVar57._12_4_ >> 4;
          auVar52 = auVar52 & auVar21;
          auVar39 = pshufb(auVar22,auVar52);
          auVar55 = pshufb(auVar5,auVar57 & auVar4);
          auVar55 = auVar55 & auVar39;
          auVar72[0] = -('\0' < auVar55[0]);
          auVar72[1] = -('\0' < auVar55[1]);
          auVar72[2] = -('\0' < auVar55[2]);
          auVar72[3] = -('\0' < auVar55[3]);
          auVar72[4] = -('\0' < auVar55[4]);
          auVar72[5] = -('\0' < auVar55[5]);
          auVar72[6] = -('\0' < auVar55[6]);
          auVar72[7] = -('\0' < auVar55[7]);
          auVar72[8] = -('\0' < auVar55[8]);
          auVar72[9] = -('\0' < auVar55[9]);
          auVar72[10] = -('\0' < auVar55[10]);
          auVar72[0xb] = -('\0' < auVar55[0xb]);
          auVar72[0xc] = -('\0' < auVar55[0xc]);
          auVar72[0xd] = -('\0' < auVar55[0xd]);
          auVar72[0xe] = -('\0' < auVar55[0xe]);
          bVar13 = '\0' < auVar55[0xf];
          auVar72[0xf] = -bVar13;
          uVar9 = uVar14 - 1;
          if ((((((((((((((((auVar72 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar72 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar72 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar72 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar72 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar72 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar72 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar72 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar72 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar72 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar72 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar72 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar72[0xf]) {
            auVar53[0] = auVar52[0] - (auVar57[0] == cVar23);
            auVar53[1] = auVar52[1] - (auVar57[1] == cVar24);
            auVar53[2] = auVar52[2] - (auVar57[2] == cVar25);
            auVar53[3] = auVar52[3] - (auVar57[3] == cVar26);
            auVar53[4] = auVar52[4] - (auVar57[4] == cVar27);
            auVar53[5] = auVar52[5] - (auVar57[5] == cVar28);
            auVar53[6] = auVar52[6] - (auVar57[6] == cVar29);
            auVar53[7] = auVar52[7] - (auVar57[7] == cVar30);
            auVar53[8] = auVar52[8] - (auVar57[8] == cVar31);
            auVar53[9] = auVar52[9] - (auVar57[9] == cVar32);
            auVar53[10] = auVar52[10] - (auVar57[10] == cVar33);
            auVar53[0xb] = auVar52[0xb] - (auVar57[0xb] == cVar34);
            auVar53[0xc] = auVar52[0xc] - (auVar57[0xc] == cVar35);
            auVar53[0xd] = auVar52[0xd] - (auVar57[0xd] == cVar36);
            auVar53[0xe] = auVar52[0xe] - (auVar57[0xe] == cVar37);
            auVar53[0xf] = auVar52[0xf] - (auVar57[0xf] == cVar38);
            auVar39 = pshufb(auVar20,auVar53);
            auVar64[0] = auVar39[0] + auVar57[0];
            auVar64[1] = auVar39[1] + auVar57[1];
            auVar64[2] = auVar39[2] + auVar57[2];
            auVar64[3] = auVar39[3] + auVar57[3];
            auVar64[4] = auVar39[4] + auVar57[4];
            auVar64[5] = auVar39[5] + auVar57[5];
            auVar64[6] = auVar39[6] + auVar57[6];
            auVar64[7] = auVar39[7] + auVar57[7];
            auVar64[8] = auVar39[8] + auVar57[8];
            auVar64[9] = auVar39[9] + auVar57[9];
            auVar64[10] = auVar39[10] + auVar57[10];
            auVar64[0xb] = auVar39[0xb] + auVar57[0xb];
            auVar64[0xc] = auVar39[0xc] + auVar57[0xc];
            auVar64[0xd] = auVar39[0xd] + auVar57[0xd];
            auVar64[0xe] = auVar39[0xe] + auVar57[0xe];
            auVar64[0xf] = auVar39[0xf] + auVar57[0xf];
            auVar57 = pmaddubsw(auVar64,auVar6);
            auVar57 = pmaddwd(auVar57,auVar7);
            auVar57 = pshufb(auVar57,auVar8);
            *(undefined1 (*) [16])out = auVar57;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar9 = uVar14 - 2;
          }
          uVar14 = uVar9;
          if (((((((((((((((((auVar72 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                            (auVar72 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar72 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar72 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar72 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar72 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar72 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar72 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar72 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar72 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar72 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar72 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar13) ||
             (uVar14 == 0)) goto LAB_001053a0;
          goto LAB_00104e52;
        }
        if (3 < uVar14) goto LAB_001050ab;
        auVar57 = *(undefined1 (*) [16])src;
        auVar54._0_4_ = auVar57._0_4_ >> 4;
        auVar54._4_4_ = auVar57._4_4_ >> 4;
        auVar54._8_4_ = auVar57._8_4_ >> 4;
        auVar54._12_4_ = auVar57._12_4_ >> 4;
        auVar50 = auVar54 & auVar21;
        auVar39 = pshufb(auVar22,auVar50);
        auVar55 = pshufb(auVar5,auVar57 & auVar4);
        auVar55 = auVar55 & auVar39;
        auVar73[0] = -('\0' < auVar55[0]);
        auVar73[1] = -('\0' < auVar55[1]);
        auVar73[2] = -('\0' < auVar55[2]);
        auVar73[3] = -('\0' < auVar55[3]);
        auVar73[4] = -('\0' < auVar55[4]);
        auVar73[5] = -('\0' < auVar55[5]);
        auVar73[6] = -('\0' < auVar55[6]);
        auVar73[7] = -('\0' < auVar55[7]);
        auVar73[8] = -('\0' < auVar55[8]);
        auVar73[9] = -('\0' < auVar55[9]);
        auVar73[10] = -('\0' < auVar55[10]);
        auVar73[0xb] = -('\0' < auVar55[0xb]);
        auVar73[0xc] = -('\0' < auVar55[0xc]);
        auVar73[0xd] = -('\0' < auVar55[0xd]);
        auVar73[0xe] = -('\0' < auVar55[0xe]);
        auVar73[0xf] = -('\0' < auVar55[0xf]);
        uVar2 = (ushort)(SUB161(auVar73 >> 7,0) & 1) | (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe | (ushort)(auVar73[0xf] >> 7) << 0xf;
        if (1 < uVar14) goto joined_r0x0010534a;
        if (uVar2 == 0) {
          auVar21[0] = auVar50[0] - (auVar57[0] == '/');
          auVar21[1] = auVar50[1] - (auVar57[1] == '/');
          auVar21[2] = auVar50[2] - (auVar57[2] == '/');
          auVar21[3] = auVar50[3] - (auVar57[3] == '/');
          auVar21[4] = auVar50[4] - (auVar57[4] == '/');
          auVar21[5] = auVar50[5] - (auVar57[5] == '/');
          auVar21[6] = auVar50[6] - (auVar57[6] == '/');
          auVar21[7] = auVar50[7] - (auVar57[7] == '/');
          auVar21[8] = auVar50[8] - (auVar57[8] == '/');
          auVar21[9] = auVar50[9] - (auVar57[9] == '/');
          auVar21[10] = auVar50[10] - (auVar57[10] == '/');
          auVar21[0xb] = auVar50[0xb] - (auVar57[0xb] == '/');
          auVar21[0xc] = auVar50[0xc] - (auVar57[0xc] == '/');
          auVar21[0xd] = auVar50[0xd] - (auVar57[0xd] == '/');
          auVar21[0xe] = auVar50[0xe] - (auVar57[0xe] == '/');
          auVar21[0xf] = auVar50[0xf] - (auVar57[0xf] == '/');
          auVar21 = pshufb(auVar20,auVar21);
          auVar22[0] = auVar21[0] + auVar57[0];
          auVar22[1] = auVar21[1] + auVar57[1];
          auVar22[2] = auVar21[2] + auVar57[2];
          auVar22[3] = auVar21[3] + auVar57[3];
          auVar22[4] = auVar21[4] + auVar57[4];
          auVar22[5] = auVar21[5] + auVar57[5];
          auVar22[6] = auVar21[6] + auVar57[6];
          auVar22[7] = auVar21[7] + auVar57[7];
          auVar22[8] = auVar21[8] + auVar57[8];
          auVar22[9] = auVar21[9] + auVar57[9];
          auVar22[10] = auVar21[10] + auVar57[10];
          auVar22[0xb] = auVar21[0xb] + auVar57[0xb];
          auVar22[0xc] = auVar21[0xc] + auVar57[0xc];
          auVar22[0xd] = auVar21[0xd] + auVar57[0xd];
          auVar22[0xe] = auVar21[0xe] + auVar57[0xe];
          auVar22[0xf] = auVar21[0xf] + auVar57[0xf];
          auVar21 = pmaddubsw(auVar22,_DAT_0010c030);
          auVar21 = pmaddwd(auVar21,_DAT_0010c040);
          auVar21 = pshufb(auVar21,_DAT_0010c050);
          *(undefined1 (*) [16])out = auVar21;
          src = (char *)((long)src + 0x10);
          out = *(undefined1 (*) [16])out + 0xc;
          uVar14 = uVar14 - 1;
        }
LAB_001053a0:
        srclen = (srclen - (srclen - 8 & 0xfffffffffffffff0)) + uVar14 * 0x10;
        sVar18 = sVar18 + (uVar19 - uVar14) * 0xc;
      }
      bVar13 = srclen == 0;
      srclen = srclen - 1;
      if (bVar13) {
        uVar16 = 0;
        bVar13 = true;
        iVar11 = 0;
        break;
      }
      puVar3 = *(undefined1 (*) [16])src;
      if (0xfd < base64_table_dec_8bit[(byte)*puVar3]) {
        bVar13 = false;
        goto LAB_001054da;
      }
      src = *(undefined1 (*) [16])src + 1;
      bVar15 = base64_table_dec_8bit[(byte)*puVar3] << 2;
      sVar17 = sVar18;
switchD_00104dc4_caseD_1:
      uVar16 = 1;
      sVar12 = srclen - 1;
      sVar18 = sVar17;
      if (srclen == 0) {
LAB_0010548c:
        bVar13 = true;
        break;
      }
      bVar1 = base64_table_dec_8bit[(byte)*src];
      if (0xfd < bVar1) {
        iVar11 = 2;
        uVar10 = 1;
        goto switchD_00104dc4_default;
      }
      src = (char *)((byte *)src + 1);
      (*(undefined1 (*) [16])out)[0] = bVar1 >> 4 | bVar15;
      out = *(undefined1 (*) [16])out + 1;
      bVar15 = bVar1 << 4;
      sVar17 = sVar17 + 1;
switchD_00104dc4_caseD_2:
      bVar13 = true;
      srclen = sVar12 - 1;
      sVar18 = sVar17;
      if (sVar12 == 0) {
        uVar16 = 2;
        break;
      }
      bVar1 = *src;
      src = (char *)((byte *)src + 1);
      bVar1 = base64_table_dec_8bit[bVar1];
      if (0xfd < bVar1) {
        iVar11 = 0;
        uVar16 = 3;
        uVar10 = 3;
        if (bVar1 != 0xfe) goto switchD_00104dc4_default;
        if (srclen != 0) {
          bVar1 = base64_table_dec_8bit[(byte)*src];
          bVar13 = sVar12 == 2;
          goto LAB_001054c7;
        }
        iVar11 = 1;
        break;
      }
      *out = bVar1 >> 2 | bVar15;
      out = (char *)((byte *)out + 1);
      bVar15 = bVar1 << 6;
      sVar17 = sVar17 + 1;
switchD_00104dc4_caseD_3:
      bVar13 = srclen == 0;
      srclen = srclen - 1;
      sVar18 = sVar17;
      if (bVar13) {
        uVar16 = 3;
        goto LAB_0010548c;
      }
      bVar1 = base64_table_dec_8bit[(byte)*src];
      if (0xfd < bVar1) goto code_r0x0010547e;
      src = (char *)((byte *)src + 1);
      *out = bVar1 | bVar15;
      out = (char *)((byte *)out + 1);
      sVar18 = sVar17 + 1;
      bVar15 = 0;
    } while( true );
  case 1:
    goto switchD_00104dc4_caseD_1;
  case 2:
    goto switchD_00104dc4_caseD_2;
  case 3:
    goto switchD_00104dc4_caseD_3;
  default:
switchD_00104dc4_default:
    uVar16 = uVar10;
    bVar13 = false;
    sVar18 = sVar17;
  }
  goto LAB_001054dd;
code_r0x0010547e:
  bVar13 = srclen == 0;
LAB_001054c7:
  bVar13 = (bool)(bVar13 & bVar1 == 0xfe);
LAB_001054da:
  iVar11 = 2;
  uVar16 = 0;
LAB_001054dd:
  state->eof = iVar11;
  state->bytes = uVar16;
  state->carry = bVar15;
  *outlen = sVar18;
LAB_001054ea:
  return (int)bVar13;
}

Assistant:

BASE64_DEC_FUNCTION(sse41)
{
#if HAVE_SSE41
	#include "../generic/dec_head.c"
	dec_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/dec_tail.c"
#else
	BASE64_DEC_STUB
#endif
}